

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void VP8LTransformColorInverse_C(VP8LMultipliers *m,uint32_t *src,int num_pixels,uint32_t *dst)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)num_pixels;
  if (num_pixels < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = src[uVar2];
    iVar5 = (int)(char)(uVar1 >> 8);
    bVar4 = (char)((char)m->green_to_red * iVar5 >> 5) + (char)(uVar1 >> 0x10);
    dst[uVar2] = (uint)bVar4 << 0x10 | uVar1 & 0xff00ff00 |
                 ((uint)((int)(char)m->red_to_blue * (int)(char)bVar4) >> 5) +
                 ((uint)((char)m->green_to_blue * iVar5) >> 5) + uVar1 & 0xff;
  }
  return;
}

Assistant:

void VP8LTransformColorInverse_C(const VP8LMultipliers* const m,
                                 const uint32_t* src, int num_pixels,
                                 uint32_t* dst) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = src[i];
    const int8_t green = (int8_t)(argb >> 8);
    const uint32_t red = argb >> 16;
    int new_red = red & 0xff;
    int new_blue = argb & 0xff;
    new_red += ColorTransformDelta((int8_t)m->green_to_red, green);
    new_red &= 0xff;
    new_blue += ColorTransformDelta((int8_t)m->green_to_blue, green);
    new_blue += ColorTransformDelta((int8_t)m->red_to_blue, (int8_t)new_red);
    new_blue &= 0xff;
    dst[i] = (argb & 0xff00ff00u) | (new_red << 16) | (new_blue);
  }
}